

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

nng_err http_server_init(nni_http_server **serverp,nng_url *url)

{
  nni_http_server *s_00;
  char *pcVar1;
  char *scheme;
  nng_url my_url;
  nng_err rv;
  nni_http_server *s;
  nng_url *url_local;
  nni_http_server **serverp_local;
  
  scheme = nni_http_stream_scheme(url->u_scheme);
  if (scheme == (char *)0x0) {
    serverp_local._4_4_ = NNG_EADDRINVAL;
  }
  else {
    memcpy(&scheme,url,200);
    s_00 = (nni_http_server *)nni_zalloc(0x328);
    if (s_00 == (nni_http_server *)0x0) {
      serverp_local._4_4_ = NNG_ENOMEM;
    }
    else {
      nni_mtx_init(&s_00->mtx);
      nni_mtx_init(&s_00->errors_mtx);
      nni_list_init_offset(&s_00->handlers,0);
      nni_list_init_offset(&s_00->conns,0);
      nni_mtx_init(&s_00->errors_mtx);
      nni_list_init_offset(&s_00->errors,0);
      nni_aio_init(&s_00->accaio,http_server_acccb,s_00);
      s_00->port = url->u_port;
      pcVar1 = nni_strdup(url->u_hostname);
      s_00->hostname = pcVar1;
      if (pcVar1 == (char *)0x0) {
        http_server_fini(s_00);
        serverp_local._4_4_ = NNG_ENOMEM;
      }
      else {
        my_url.u_static._124_4_ = nng_stream_listener_alloc_url(&s_00->listener,(nng_url *)&scheme);
        if (my_url.u_static._124_4_ == 0) {
          s_00->refcnt = 1;
          *serverp = s_00;
          serverp_local._4_4_ = NNG_OK;
        }
        else {
          http_server_fini(s_00);
          serverp_local._4_1_ = my_url.u_static[0x7c];
          serverp_local._5_1_ = my_url.u_static[0x7d];
          serverp_local._6_1_ = my_url.u_static[0x7e];
          serverp_local._7_1_ = my_url.u_static[0x7f];
        }
      }
    }
  }
  return serverp_local._4_4_;
}

Assistant:

static nng_err
http_server_init(nni_http_server **serverp, const nng_url *url)
{
	nni_http_server *s;
	nng_err          rv;
	nng_url          my_url;
	const char      *scheme;

	if ((scheme = nni_http_stream_scheme(url->u_scheme)) == NULL) {
		return (NNG_EADDRINVAL);
	}
	// Rewrite URLs to either TLS or TCP.
	memcpy(&my_url, url, sizeof(my_url));
	my_url.u_scheme = (char *) scheme;

	if ((s = NNI_ALLOC_STRUCT(s)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_mtx_init(&s->mtx);
	nni_mtx_init(&s->errors_mtx);
	NNI_LIST_INIT(&s->handlers, nni_http_handler, node);
	NNI_LIST_INIT(&s->conns, http_sconn, node);

	nni_mtx_init(&s->errors_mtx);
	NNI_LIST_INIT(&s->errors, http_error, node);

	nni_aio_init(&s->accaio, http_server_acccb, s);

	s->port = url->u_port;

	if ((s->hostname = nni_strdup(url->u_hostname)) == NULL) {
		http_server_fini(s);
		return (NNG_ENOMEM);
	}

	if ((rv = nng_stream_listener_alloc_url(&s->listener, &my_url)) != 0) {
		http_server_fini(s);
		return (rv);
	}

	s->refcnt = 1;
	*serverp  = s;
	return (NNG_OK);
}